

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

Type * __thiscall
soul::AST::EndpointDetails::getDataType
          (Type *__return_storage_ptr__,EndpointDetails *this,Expression *e)

{
  Category CVar1;
  bool bVar2;
  PrimitiveType PVar3;
  BoundedIntSize BVar4;
  bool bVar5;
  int iVar6;
  Structure *pSVar7;
  pointer other;
  pointer pTVar8;
  vector<soul::Type,_std::allocator<soul::Type>_> local_68;
  EndpointDetails *local_50;
  Type local_48;
  
  local_50 = this;
  getSampleArrayTypes(&local_68,this);
  pTVar8 = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    other = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
            super__Vector_impl_data._M_start;
    do {
      (*(e->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_48,e);
      bVar5 = Type::isEqual(&local_48,other,4);
      RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
      if (bVar5) {
        CVar1 = other->arrayElementCategory;
        bVar5 = other->isRef;
        bVar2 = other->isConstant;
        PVar3.type = (other->primitiveType).type;
        __return_storage_ptr__->category = other->category;
        __return_storage_ptr__->arrayElementCategory = CVar1;
        __return_storage_ptr__->isRef = bVar5;
        __return_storage_ptr__->isConstant = bVar2;
        __return_storage_ptr__->primitiveType = (PrimitiveType)PVar3.type;
        BVar4 = other->arrayElementBoundingSize;
        __return_storage_ptr__->boundingSize = other->boundingSize;
        __return_storage_ptr__->arrayElementBoundingSize = BVar4;
        pSVar7 = (other->structure).object;
        goto LAB_002403c2;
      }
      other = other + 1;
    } while (other != pTVar8);
  }
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
  getSampleArrayTypes(&local_68,local_50);
  pTVar8 = local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pTVar8 == local_68.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
      throwInternalCompilerError("getDataType",0x414);
    }
    iVar6 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(e,pTVar8);
    if ((char)iVar6 != '\0') break;
    pTVar8 = pTVar8 + 1;
  }
  CVar1 = pTVar8->arrayElementCategory;
  bVar5 = pTVar8->isRef;
  bVar2 = pTVar8->isConstant;
  PVar3.type = (pTVar8->primitiveType).type;
  __return_storage_ptr__->category = pTVar8->category;
  __return_storage_ptr__->arrayElementCategory = CVar1;
  __return_storage_ptr__->isRef = bVar5;
  __return_storage_ptr__->isConstant = bVar2;
  __return_storage_ptr__->primitiveType = (PrimitiveType)PVar3.type;
  BVar4 = pTVar8->arrayElementBoundingSize;
  __return_storage_ptr__->boundingSize = pTVar8->boundingSize;
  __return_storage_ptr__->arrayElementBoundingSize = BVar4;
  pSVar7 = (pTVar8->structure).object;
LAB_002403c2:
  (__return_storage_ptr__->structure).object = pSVar7;
  if (pSVar7 != (Structure *)0x0) {
    (pSVar7->super_RefCountedObject).refCount = (pSVar7->super_RefCountedObject).refCount + 1;
  }
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Type getDataType (Expression& e) const
        {
            for (auto& type : getSampleArrayTypes())
                if (e.getResultType().isEqual (type, Type::ignoreVectorSize1))
                    return type;

            for (auto& type : getSampleArrayTypes())
                if (e.canSilentlyCastTo (type))
                    return type;

            SOUL_ASSERT_FALSE;
            return {};
        }